

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetVersion(Btree *pBtree,int iVersion)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  u8 *aData;
  int rc;
  BtShared *pBt;
  int *in_stack_ffffffffffffffd8;
  PgHdr *pPg;
  Btree *p;
  
  p = *(Btree **)(in_RDI + 8);
  *(ushort *)&p->pPrev = *(ushort *)&p->pPrev & 0xffdf;
  if (in_ESI == 1) {
    *(ushort *)&p->pPrev = *(ushort *)&p->pPrev | 0x20;
  }
  iVar1 = sqlite3BtreeBeginTrans(p,-0x55555556,in_stack_ffffffffffffffd8);
  if (((iVar1 == 0) &&
      (((pPg = *(PgHdr **)(*(long *)&p->nBackup + 0x50),
        (uint)*(byte *)((long)&pPg->pExtra + 2) != (in_ESI & 0xff) ||
        ((uint)*(byte *)((long)&pPg->pExtra + 3) != (in_ESI & 0xff))) &&
       (iVar1 = sqlite3BtreeBeginTrans(p,0,(int *)pPg), iVar1 == 0)))) &&
     (iVar1 = sqlite3PagerWrite(pPg), iVar1 == 0)) {
    *(char *)((long)&pPg->pExtra + 2) = (char)in_ESI;
    *(char *)((long)&pPg->pExtra + 3) = (char)in_ESI;
  }
  *(ushort *)&p->pPrev = *(ushort *)&p->pPrev & 0xffdf;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetVersion(Btree *pBtree, int iVersion){
  BtShared *pBt = pBtree->pBt;
  int rc;                         /* Return code */

  assert( iVersion==1 || iVersion==2 );

  /* If setting the version fields to 1, do not automatically open the
  ** WAL connection, even if the version fields are currently set to 2.
  */
  pBt->btsFlags &= ~BTS_NO_WAL;
  if( iVersion==1 ) pBt->btsFlags |= BTS_NO_WAL;

  rc = sqlite3BtreeBeginTrans(pBtree, 0, 0);
  if( rc==SQLITE_OK ){
    u8 *aData = pBt->pPage1->aData;
    if( aData[18]!=(u8)iVersion || aData[19]!=(u8)iVersion ){
      rc = sqlite3BtreeBeginTrans(pBtree, 2, 0);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          aData[18] = (u8)iVersion;
          aData[19] = (u8)iVersion;
        }
      }
    }
  }

  pBt->btsFlags &= ~BTS_NO_WAL;
  return rc;
}